

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O1

void __thiscall pstore::storage::truncate_to_physical_size(storage *this)

{
  element_type *peVar1;
  pointer psVar2;
  element_type *peVar3;
  long lVar4;
  
  peVar1 = (this->file_).super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  psVar2 = (this->regions_).
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->regions_).
      super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
      ._M_impl.super__Vector_impl_data._M_start == psVar2) {
    lVar4 = 0;
  }
  else {
    peVar3 = psVar2[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lVar4 = peVar3->size_ + peVar3->offset_;
  }
  (*peVar1->_vptr_file_base[10])(peVar1,lVar4);
  return;
}

Assistant:

void storage::truncate_to_physical_size () {
        file_->truncate (regions_.empty () ? 0 : regions_.back ()->end ());
    }